

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_calculator.cpp
# Opt level: O3

bool __thiscall
ON_ArithmeticCalculatorImplementation::AppendArithmeticOperator
          (ON_ArithmeticCalculatorImplementation *this,ARITHMETIC_OP op)

{
  uint uVar1;
  bool bVar2;
  ARITHMETIC_OP AVar3;
  ulong uVar4;
  
  if (this->m_error_condition == '\0') {
    uVar4 = (ulong)this->m_op_stack_pointer;
    uVar1 = this->m_expression_depth;
    if ((((this->m_op_stack_pointer == 0 && uVar1 == 0) ||
         (this->m_bPendingUnaryMinus != '\0' || this->m_bPendingUnaryPlus != '\0')) || (uVar1 == 0))
       || ((this->m_op_stack[uVar4].m_op != op_number || (uVar1 != this->m_op_stack[uVar4].m_level))
          )) {
      this->m_op_stack_pointer = 0;
      this->m_expression_depth = 0;
      this->m_op_stack[0].m_x = 0.0;
      this->m_op_stack[0].m_op = op_unset;
      this->m_op_stack[0].m_level = 0;
      this->m_bPendingImpliedMultiplication = '\0';
      this->m_bPendingUnaryPlus = '\0';
      this->m_bPendingUnaryMinus = '\0';
      this->m_bUnsetValue = '\0';
      this->m_error_condition = '\x02';
    }
    else {
      this->m_bPendingImpliedMultiplication = '\0';
      if (((op & ~op_number) == op_add) &&
         (AVar3 = ArithmeticOperationIsPending(this), (AVar3 & ~op_number) == op_add)) {
        bVar2 = EvaluatePendingArithmeticOperation(this);
        if (!bVar2) {
          return false;
        }
        uVar4 = (ulong)this->m_op_stack_pointer;
      }
      this->m_op_stack[uVar4].m_op = op;
    }
  }
  return true;
}

Assistant:

bool ON_ArithmeticCalculatorImplementation::AppendArithmeticOperator( 
  ON_ArithmeticCalculatorImplementation::ARITHMETIC_OP op 
  )
{
  bool rc = false;

  for(;;)
  {
    if (m_error_condition)
      break;

    if ( IsEmpty() )
    {
      SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
      break;
    }

    if ( m_bPendingUnaryPlus || m_bPendingUnaryMinus )
    {
      SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
      break;
    }

    if ( m_expression_depth < 1 )
    {
      SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
      break;
    }

    if ( ON_ArithmeticCalculatorImplementation::op_number != m_op_stack[m_op_stack_pointer].m_op )
    {
      SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
      break;
    }

    if ( m_expression_depth != m_op_stack[m_op_stack_pointer].m_level )
    {
      SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
      break;
    }

    // specifying an explicit aritimetic operator clears the
    // potential for implied multiplication that occures after
    // a "symbol" value or right parenthesis.
    m_bPendingImpliedMultiplication = false;

    switch( op )
    {
    case ON_ArithmeticCalculatorImplementation::op_add:
    case ON_ArithmeticCalculatorImplementation::op_sub:
      switch(ArithmeticOperationIsPending())
      {
        case ON_ArithmeticCalculatorImplementation::op_add:
        case ON_ArithmeticCalculatorImplementation::op_sub:
          if ( !EvaluatePendingArithmeticOperation() )
            return false;
        break;
        default:
          break;
      }
      break;
    default:
      break;
    }

    m_op_stack[m_op_stack_pointer].m_op = op;
    rc = true;

    break;
  }

  return true;
}